

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

char * __thiscall FCommandLine::operator[](FCommandLine *this,int i)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  char **ppcVar4;
  int count;
  int i_local;
  FCommandLine *this_local;
  
  if (this->_argv == (char **)0x0) {
    iVar2 = argc(this);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2 + (this->argsize + 7U >> 3);
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppcVar4 = (char **)operator_new__(uVar3);
    this->_argv = ppcVar4;
    *this->_argv = (char *)(this->_argv + iVar2);
    ParseCommandLine(this->cmd,(int *)0x0,this->_argv,(bool)(this->noescapes & 1));
  }
  return this->_argv[i];
}

Assistant:

char *FCommandLine::operator[] (int i)
{
	if (_argv == NULL)
	{
		int count = argc();
		_argv = new char *[count + (argsize+sizeof(char*)-1)/sizeof(char*)];
		_argv[0] = (char *)_argv + count*sizeof(char *);
		ParseCommandLine (cmd, NULL, _argv, noescapes);
	}
	return _argv[i];
}